

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O3

int __thiscall despot::option::Option::init(Option *this,EVP_PKEY_CTX *ctx)

{
  Option *pOVar1;
  char *in_RCX;
  char *in_RDX;
  
  this->desc = (Descriptor *)ctx;
  this->name = in_RDX;
  this->arg = in_RCX;
  pOVar1 = (Option *)((ulong)this | 1);
  this->prev_ = pOVar1;
  this->next_ = pOVar1;
  this->namelen = 0;
  if ((in_RDX != (char *)0x0) && (this->namelen = 1, *in_RDX == '-')) {
    pOVar1 = (Option *)0x1;
    while ((in_RDX[(long)pOVar1] != '\0' && (in_RDX[(long)pOVar1] != '='))) {
      pOVar1 = (Option *)((long)&pOVar1->next_ + 1);
      this->namelen = (int)pOVar1;
    }
  }
  return (int)pOVar1;
}

Assistant:

void init(const Descriptor* desc_, const char* name_, const char* arg_) {
		desc = desc_;
		name = name_;
		arg = arg_;
		prev_ = tag(this);
		next_ = tag(this);
		namelen = 0;
		if (name == 0)
			return;
		namelen = 1;
		if (name[0] != '-')
			return;
		while (name[namelen] != 0 && name[namelen] != '=')
			++namelen;
	}